

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

char * __thiscall Path::basename(Path *this,char *__filename)

{
  size_t sVar1;
  allocator local_11;
  
  if (*(long *)(__filename + 8) == 0) {
    std::__cxx11::string::string((string *)this,"",&local_11);
  }
  else {
    sVar1 = find_last_slash((string *)__filename);
    if (sVar1 == 0xffffffffffffffff) {
      std::__cxx11::string::string((string *)this,(string *)__filename);
    }
    else {
      std::__cxx11::string::substr((ulong)this,(ulong)__filename);
    }
  }
  return (char *)this;
}

Assistant:

string basename(const string &path)
{
	if (path.empty())
		return "";

	auto index = find_last_slash(path);
	if (index == string::npos)
		return path;

	auto base = path.substr(index + 1, string::npos);
	return base;
}